

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

pair<std::shared_ptr<void>,_pstore::address> * __thiscall
pstore::transaction_base::alloc_rw
          (pair<std::shared_ptr<void>,_pstore::address> *__return_storage_ptr__,
          transaction_base *this,size_t size,uint align)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  shared_ptr<void> ptr;
  
  iVar1 = (*this->_vptr_transaction_base[2])(this,size,(ulong)align);
  (*this->db_->_vptr_database[2])(local_40,this->db_,CONCAT44(extraout_var,iVar1),size,0,1);
  std::const_pointer_cast<void,void_const>
            ((shared_ptr<const_void> *)&ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
             &ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
  (__return_storage_ptr__->second).a_ = CONCAT44(extraout_var,iVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<void>, address> transaction_base::alloc_rw (std::size_t const size,
                                                                          unsigned const align) {
        address const addr = this->allocate (size, align);
        // We call database::get() with the initialized parameter set to false because this
        // is new storage: there's no need to copy its existing contents if the block spans
        // more than one region.
        auto ptr = std::const_pointer_cast<void> (db_.get (addr, size,
                                                           false,  // initialized?
                                                           true)); // writable?
        return {ptr, addr};
    }